

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

deUint32 deGetNumAvailableLogicalCores(void)

{
  long lVar1;
  long count;
  long ret;
  deUint64 dStack_18;
  uint maskSize;
  unsigned_long mask;
  
  dStack_18 = 0;
  deMemset(&stack0xffffffffffffffe8,0,8);
  lVar1 = syscall(0xcc,0,8,&stack0xffffffffffffffe8);
  if (lVar1 < 1) {
    lVar1 = sysconf(0x54);
    if (lVar1 < 1) {
      mask._4_4_ = 1;
    }
    else {
      mask._4_4_ = (deUint32)lVar1;
    }
  }
  else {
    mask._4_4_ = dePop64(dStack_18);
  }
  return mask._4_4_;
}

Assistant:

deUint32 deGetNumAvailableLogicalCores (void)
{
	unsigned long		mask		= 0;
	const unsigned int	maskSize	= sizeof(mask);
	long				ret;

	deMemset(&mask, 0, sizeof(mask));

	ret = syscall(__NR_sched_getaffinity, 0, maskSize, &mask);

	if (ret > 0)
	{
		return (deUint32)dePop64(mask);
	}
	else
	{
#if defined(_SC_NPROCESSORS_ONLN)
		const long count = sysconf(_SC_NPROCESSORS_ONLN);

		if (count <= 0)
			return 1;
		else
			return (deUint32)count;
#else
		return 1;
#endif
	}
}